

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O2

void ot::commissioner::CommissionerSafe::Invoke(int param_1,short param_2,void *aContext)

{
  AsyncRequest asyncReq;
  AsyncRequest AStack_28;
  
  if (aContext != (void *)0x0) {
    PopAsyncRequest(&AStack_28,(CommissionerSafe *)aContext);
    if (AStack_28.super__Function_base._M_manager != (_Manager_type)0x0) {
      std::function<void_()>::operator()(&AStack_28);
    }
    std::_Function_base::~_Function_base(&AStack_28.super__Function_base);
    return;
  }
  abort();
}

Assistant:

void CommissionerSafe::Invoke(evutil_socket_t, short, void *aContext)
{
    auto commissionerSafe = reinterpret_cast<CommissionerSafe *>(aContext);

    VerifyOrDie(commissionerSafe != nullptr);

    if (auto asyncReq = commissionerSafe->PopAsyncRequest())
    {
        asyncReq();
    }
}